

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_trng::hypergeometric_dist_&,_const_trng::hypergeometric_dist_&> * __thiscall
Catch::ExprLhs<trng::hypergeometric_dist_const&>::operator==
          (BinaryExpr<const_trng::hypergeometric_dist_&,_const_trng::hypergeometric_dist_&>
           *__return_storage_ptr__,ExprLhs<trng::hypergeometric_dist_const&> *this,
          hypergeometric_dist *rhs)

{
  hypergeometric_dist *phVar1;
  bool bVar2;
  StringRef local_38;
  
  phVar1 = *(hypergeometric_dist **)this;
  if (((phVar1->P).n_ == (rhs->P).n_) && ((phVar1->P).m_ == (rhs->P).m_)) {
    bVar2 = (phVar1->P).d_ == (rhs->P).d_;
  }
  else {
    bVar2 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00318478;
  __return_storage_ptr__->m_lhs = phVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }